

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_ExtractByStlStrView_Test<char32_t>::Body
          (iu_StringSplitLvalue_x_iutest_x_ExtractByStlStrView_Test<char32_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_R9;
  AssertionResult iutest_ar;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> s;
  wchar_t *local_2b0;
  AssertionHelper local_2a8;
  AssertionResult local_278;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_250;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_220 [7];
  ios_base local_1b0 [264];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_88;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_48;
  
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_250,L"arikitari na_world!",L"");
  local_2b0 = L"arikitari";
  local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x2;
  local_2a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0x24343c;
  local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity = 0;
  detail::
  operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_230,&local_250,
             (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
              *)&local_2a8);
  iutest::internal::CmpHelperEQ<char32_t_const*,std::__cxx11::u32string>
            (&local_278,(internal *)"constant::arikitari<char_type>()","s | split(delim)[0]",
             (char *)&local_2b0,(char32_t **)local_230,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity * 4 + 4);
  }
  if (local_278.m_result == false) {
    memset((iu_global_format_stringstream *)local_230,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,local_278.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_2b0);
    local_2a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x10f;
    local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
    std::ios_base::~ios_base(local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_message._M_dataplus._M_p == &local_278.m_message.field_2) goto LAB_00189b4c;
  }
  else {
    paVar1 = &local_278.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_message._M_dataplus._M_p,
                      local_278.m_message.field_2._M_allocated_capacity + 1);
    }
    local_2b0 = L"na";
    local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x2;
    local_2a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0x24343c;
    local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity = 1;
    detail::
    operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_230,&local_250,
               (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                *)&local_2a8);
    iutest::internal::CmpHelperEQ<char32_t_const*,std::__cxx11::u32string>
              (&local_278,(internal *)"constant::na<char_type>()","s | split(delim)[1]",
               (char *)&local_2b0,(char32_t **)local_230,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity * 4 + 4);
    }
    if (local_278.m_result == false) {
      memset((iu_global_format_stringstream *)local_230,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_230);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,local_278.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_2b0);
      local_2a8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x110;
      local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_278.m_message._M_dataplus._M_p,
                        local_278.m_message.field_2._M_allocated_capacity + 1);
      }
      local_2b0 = L"world!";
      local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x2;
      local_2a8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0x24343c;
      local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity = 2;
      detail::
      operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_230,&local_250,
                 (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                  *)&local_2a8);
      iutest::internal::CmpHelperEQ<char32_t_const*,std::__cxx11::u32string>
                (&local_278,(internal *)"constant::world<char_type>()","s | split(delim)[2]",
                 (char *)&local_2b0,(char32_t **)local_230,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_230._0_8_ != local_220) {
        operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity * 4 + 4);
      }
      if (local_278.m_result != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_278.m_message._M_dataplus._M_p,
                          local_278.m_message.field_2._M_allocated_capacity + 1);
        }
        local_230._0_8_ = (pointer)0x2;
        local_230._8_8_ = L"_ ";
        local_220[0]._M_allocated_capacity = 3;
        detail::
        operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
                  (&local_48,&local_250,
                   (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                    *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
        }
        memset((iu_global_format_stringstream *)local_230,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,
                   "\nExpected: s | split(delim)[3] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_278);
        local_2a8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x112;
        local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
        std::ios_base::~ios_base(local_1b0);
        local_230._0_8_ = (pointer)0x2;
        local_230._8_8_ = L"_ ";
        local_220[0]._M_allocated_capacity = 5;
        detail::
        operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
                  (&local_68,&local_250,
                   (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                    *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
        }
        memset((iu_global_format_stringstream *)local_230,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,
                   "\nExpected: s | split(delim)[5] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_278);
        local_2a8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x113;
        local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
        std::ios_base::~ios_base(local_1b0);
        local_230._0_8_ = (pointer)0x2;
        local_230._8_8_ = L"_ ";
        local_220[0]._M_allocated_capacity = 0xcb2;
        detail::
        operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
                  (&local_88,&local_250,
                   (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                    *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
        }
        memset((iu_global_format_stringstream *)local_230,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,
                   "\nExpected: s | split(delim)[3250] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_278);
        local_2a8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x114;
        local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
        std::ios_base::~ios_base(local_1b0);
        local_230._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
              *)0x2;
        local_230._8_8_ = L"_ ";
        local_220[0]._M_allocated_capacity = 0xffffffffffffffff;
        detail::
        operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_nullptr>
                  (&local_a8,&local_250,
                   (split_helper_index<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_false,_false,_false>
                    *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 4 + 4);
        }
        memset((iu_global_format_stringstream *)local_230,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,
                   "\nExpected: s | split(delim)[std::numeric_limits<std::size_t>::max()] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_278);
        local_2a8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x115;
        local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
        std::ios_base::~ios_base(local_1b0);
        goto LAB_00189b4c;
      }
      memset((iu_global_format_stringstream *)local_230,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_230);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,local_278.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_2b0);
      local_2a8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_2a8.m_part_result.super_iuCodeMessage.m_line = 0x111;
      local_2a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_2a8,(Fixed *)local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
    std::ios_base::~ios_base(local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_message._M_dataplus._M_p == paVar1) goto LAB_00189b4c;
  }
  operator_delete(local_278.m_message._M_dataplus._M_p,
                  local_278.m_message.field_2._M_allocated_capacity + 1);
LAB_00189b4c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}